

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O2

void strbuffer_resize_if_needed(strbuffer_t *buffer)

{
  char *pcVar1;
  size_t __size;
  
  if (buffer->capacity <= buffer->pos) {
    __size = (long)buffer->increment + (long)buffer->capacity;
    pcVar1 = (char *)realloc(buffer->data,__size);
    buffer->data = pcVar1;
    buffer->capacity = (int)__size;
  }
  return;
}

Assistant:

void strbuffer_resize_if_needed(strbuffer_t* buffer)
{
    if (buffer->pos < buffer->capacity)
        return;

    int new_capacity = buffer->capacity + buffer->increment;
    //printf("Resizing to %d\n", new_capacity);
    buffer->data = (char*) realloc(buffer->data, new_capacity * sizeof(char));
    buffer->capacity = new_capacity;
}